

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void gl4cts::CopyImage::read11F_11F_10F_Channel(GLuint channel,GLubyte *pixel,GLdouble *out_value)

{
  uint uVar1;
  Float<unsigned_long,_11,_52,_1023,_3U> FVar2;
  TestError *this;
  Float<unsigned_int,_5,_6,_15,_2U> *other;
  Float<unsigned_int,_5,_5,_15,_2U> temp_val_2;
  Float<unsigned_int,_5,_6,_15,_2U> temp_val_1;
  Float<unsigned_int,_5,_6,_15,_2U> temp_val;
  Float<unsigned_int,_5,_5,_15,_2U> local_1c;
  Float<unsigned_int,_5,_6,_15,_2U> local_18;
  Float<unsigned_int,_5,_6,_15,_2U> local_14;
  
  uVar1 = *(uint *)pixel;
  if (channel == 2) {
    local_1c.m_value = uVar1 >> 0x16;
    FVar2 = tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,5,15,2u>(&local_1c);
  }
  else {
    if (channel == 1) {
      uVar1 = uVar1 >> 0xb;
      other = &local_18;
    }
    else {
      if (channel != 0) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invalid channel",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                   ,0x7e8);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      other = &local_14;
    }
    other->m_value = uVar1 & 0x7ff;
    FVar2 = tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,6,15,2u>(other);
  }
  *out_value = (GLdouble)FVar2.m_value;
  return;
}

Assistant:

void read11F_11F_10F_Channel(GLuint channel, const GLubyte* pixel, GLdouble& out_value)
{
	const deUint32* ptr = (deUint32*)pixel;
	deUint32		val = *ptr;

	switch (channel)
	{
	case 0:
	{
		deUint32 bits = (val & 0x000007ff);
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	case 1:
	{
		deUint32 bits = ((val >> 11) & 0x000007ff);
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	case 2:
	{
		deUint32 bits = ((val >> 22) & 0x000003ff);
		tcu::Float<deUint32, 5, 5, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}
}